

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::MoveAddString
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  pointer pBVar4;
  undefined8 uVar5;
  int local_44;
  char *S;
  int X;
  int Y;
  const_iterator Iterator;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  Iterator._M_node = (_List_node_base *)Args;
  sVar3 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::size(Args);
  if (sVar3 == 3) {
    _X = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::cbegin
                   (Iterator._M_node);
    pBVar4 = std::_List_const_iterator<cvm::BasicValue>::operator->
                       ((_List_const_iterator<cvm::BasicValue> *)&X);
    iVar1 = BasicValue::toInt(pBVar4);
    std::_List_const_iterator<cvm::BasicValue>::operator++
              ((_List_const_iterator<cvm::BasicValue> *)&X);
    pBVar4 = std::_List_const_iterator<cvm::BasicValue>::operator->
                       ((_List_const_iterator<cvm::BasicValue> *)&X);
    iVar2 = BasicValue::toInt(pBVar4);
    std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::back
              ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)Iterator._M_node);
    uVar5 = std::__cxx11::string::c_str();
    iVar1 = wmove(_stdscr,iVar1,iVar2);
    if (iVar1 == -1) {
      local_44 = -1;
    }
    else {
      local_44 = waddnstr(_stdscr,uVar5,0xffffffff);
    }
    BasicValue::BasicValue(__return_storage_ptr__,local_44);
  }
  else {
    BasicValue::BasicValue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::MoveAddString(std::list<BasicValue> &Args) {
  if (Args.size() != 3)
    return BasicValue();

  auto Iterator = Args.cbegin();

  int Y = Iterator->toInt();
  ++Iterator;
  int X = Iterator->toInt();

  const char *S = Args.back().StrVal.c_str();
  return mvaddstr(Y, X, S);
}